

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::setDefaultPrecision
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType,TPrecisionQualifier qualifier
          )

{
  char cVar1;
  TBasicType t;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  t = publicType->basicType;
  uVar5 = (ulong)t;
  if (uVar5 == 0xe) {
    uVar2 = computeSamplerTypeIndex((TParseContext *)0xe,&publicType->sampler);
    this->defaultSamplerPrecision[uVar2] = qualifier;
    return;
  }
  if (uVar5 == 1) {
LAB_0042bb5e:
    if (((publicType->field_0xb8 == '\x01') && (publicType->arraySizes == (TArraySizes *)0x0)) &&
       (publicType->userDef == (TType *)0x0)) {
      this->defaultPrecision[uVar5] = qualifier;
      if (uVar5 == 8) {
        this->defaultPrecision[9] = qualifier;
        (this->precisionManager).explicitIntDefault = true;
        cVar1 = (this->precisionManager).explicitFloatDefault;
      }
      else {
        (this->precisionManager).explicitFloatDefault = true;
        cVar1 = (this->precisionManager).explicitIntDefault;
      }
      if (cVar1 != '\x01') {
        return;
      }
      (this->precisionManager).warn = false;
      return;
    }
    if (t != EbtAtomicUint) {
LAB_0042bbd1:
      pcVar3 = TType::getBasicString(t);
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar4 = 
      "cannot apply precision statement to this type; use \'float\', \'int\' or a sampler type";
      goto LAB_0042bbf7;
    }
  }
  else if (t != EbtAtomicUint) {
    if (t == EbtInt) goto LAB_0042bb5e;
    goto LAB_0042bbd1;
  }
  if (qualifier == EpqHigh) {
    return;
  }
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  pcVar4 = "can only apply highp to atomic_uint";
  pcVar3 = "precision";
LAB_0042bbf7:
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar4,pcVar3,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::setDefaultPrecision(const TSourceLoc& loc, TPublicType& publicType, TPrecisionQualifier qualifier)
{
    TBasicType basicType = publicType.basicType;

    if (basicType == EbtSampler) {
        defaultSamplerPrecision[computeSamplerTypeIndex(publicType.sampler)] = qualifier;

        return;  // all is well
    }

    if (basicType == EbtInt || basicType == EbtFloat) {
        if (publicType.isScalar()) {
            defaultPrecision[basicType] = qualifier;
            if (basicType == EbtInt) {
                defaultPrecision[EbtUint] = qualifier;
                precisionManager.explicitIntDefaultSeen();
            } else
                precisionManager.explicitFloatDefaultSeen();

            return;  // all is well
        }
    }

    if (basicType == EbtAtomicUint) {
        if (qualifier != EpqHigh)
            error(loc, "can only apply highp to atomic_uint", "precision", "");

        return;
    }

    error(loc, "cannot apply precision statement to this type; use 'float', 'int' or a sampler type", TType::getBasicString(basicType), "");
}